

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VectorErrorMsg(Parse *pParse,Expr *pExpr)

{
  if ((pExpr->flags & 0x1000) == 0) {
    sqlite3ErrorMsg(pParse,"row value misused");
    return;
  }
  if (pParse->nErr != 0) {
    return;
  }
  sqlite3ErrorMsg(pParse,"sub-select returns %d columns - expected %d",
                  (ulong)(uint)((pExpr->x).pSelect)->pEList->nExpr,1);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VectorErrorMsg(Parse *pParse, Expr *pExpr){
#ifndef SQLITE_OMIT_SUBQUERY
  if( ExprUseXSelect(pExpr) ){
    sqlite3SubselectError(pParse, pExpr->x.pSelect->pEList->nExpr, 1);
  }else
#endif
  {
    sqlite3ErrorMsg(pParse, "row value misused");
  }
}